

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.c
# Opt level: O1

void hashmap_clear(hashmap *map,_Bool update_cap)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  map->count = 0;
  free_elements(map);
  if ((int)CONCAT71(in_register_00000031,update_cap) == 0) {
    if (map->nbuckets != map->cap) {
      pvVar2 = (*map->malloc)(map->cap * map->bucketsz);
      if (pvVar2 != (void *)0x0) {
        (*map->free)(map->buckets);
        map->buckets = pvVar2;
      }
      map->nbuckets = map->cap;
    }
  }
  else {
    map->cap = map->nbuckets;
  }
  memset(map->buckets,0,map->nbuckets * map->bucketsz);
  sVar1 = map->nbuckets;
  map->mask = sVar1 - 1;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0);
  dVar4 = ((double)map->loadfactor / 100.0) * dVar6;
  uVar3 = (ulong)dVar4;
  map->growat = (long)(dVar4 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  dVar6 = dVar6 * 0.1;
  uVar3 = (ulong)dVar6;
  map->shrinkat = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  return;
}

Assistant:

void hashmap_clear(struct hashmap *map, bool update_cap) {
    map->count = 0;
    free_elements(map);
    if (update_cap) {
        map->cap = map->nbuckets;
    } else if (map->nbuckets != map->cap) {
        void *new_buckets = map->malloc(map->bucketsz*map->cap);
        if (new_buckets) {
            map->free(map->buckets);
            map->buckets = new_buckets;
        }
        map->nbuckets = map->cap;
    }
    memset(map->buckets, 0, map->bucketsz*map->nbuckets);
    map->mask = map->nbuckets-1;
    map->growat = map->nbuckets * (map->loadfactor / 100.0) ;
    map->shrinkat = map->nbuckets * SHRINK_AT;
}